

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockParameterTest_outputParameterSucceeds_TestShell::createTest
          (TEST_MockParameterTest_outputParameterSucceeds_TestShell *this)

{
  Utest *this_00;
  TEST_MockParameterTest_outputParameterSucceeds_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x271);
  TEST_MockParameterTest_outputParameterSucceeds_Test::
  TEST_MockParameterTest_outputParameterSucceeds_Test
            ((TEST_MockParameterTest_outputParameterSucceeds_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockParameterTest, outputParameterSucceeds)
{
    int param = 1;
    int retval = 2;

    mock().expectOneCall("function").withOutputParameterReturning("parameterName", &retval, sizeof(retval));
    mock().actualCall("function").withOutputParameter("parameterName", &param);

    CHECK_EQUAL(param, 2);
    CHECK_EQUAL(retval, 2);
    mock().checkExpectations();
}